

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_data_dictionary_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::
ExtendedDataDictionaryTest_TestNewFieldsDefsCanBeAddedToTheEndOfTheDictionary_Test::TestBody
          (ExtendedDataDictionaryTest_TestNewFieldsDefsCanBeAddedToTheEndOfTheDictionary_Test *this)

{
  bool bVar1;
  char *message;
  char *pcVar2;
  AssertHelper local_308;
  Message local_300;
  string local_2f8 [32];
  optional<bidfx_public_api::price::pixie::FieldDef> local_2d8;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_1;
  Message local_288;
  optional<bidfx_public_api::price::pixie::FieldDef> local_280;
  undefined1 local_248 [8];
  AssertionResult gtest_ar;
  string local_208;
  AssertHelper local_1e8;
  Message local_1e0;
  string local_1d8 [32];
  optional<bidfx_public_api::price::pixie::FieldDef> local_1b8;
  bool local_179;
  undefined1 local_178 [8];
  AssertionResult gtest_ar__1;
  string local_160;
  AssertHelper local_140;
  Message local_138;
  optional<bidfx_public_api::price::pixie::FieldDef> local_130;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_;
  allocator<char> local_c9;
  string local_c8 [32];
  FieldDef local_a8 [8];
  FieldDef endSize;
  ExtendableDataDictionary local_78 [8];
  ExtendableDataDictionary extendable_data_dictionary1;
  ExtendedDataDictionaryTest_TestNewFieldsDefsCanBeAddedToTheEndOfTheDictionary_Test *this_local;
  
  CreateExtendableDataDictionary();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"EndSize",&local_c9);
  pcVar2 = (char *)0x1;
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_a8,5000,0x4c,local_c8,0x31);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  bidfx_public_api::price::pixie::ExtendableDataDictionary::FieldDefByFid((int)&local_130);
  local_f1 = std::optional::operator_cast_to_bool((optional *)&local_130);
  local_f1 = !local_f1;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f0,&local_f1,(type *)0x0)
  ;
  std::optional<bidfx_public_api::price::pixie::FieldDef>::~optional(&local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_160,(internal *)local_f0,
               (AssertionResult *)"extendable_data_dictionary1.FieldDefByFid(endSize.fid_)","true",
               "false",pcVar2);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
               ,0x71,message);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    testing::Message::~Message(&local_138);
  }
  gtest_ar__1.message_.ptr_._5_3_ = 0;
  gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
    std::__cxx11::string::string(local_1d8,(string *)&endSize);
    bidfx_public_api::price::pixie::ExtendableDataDictionary::FieldDefByName
              (&local_1b8,local_78,local_1d8);
    local_179 = std::optional::operator_cast_to_bool((optional *)&local_1b8);
    local_179 = !local_179;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_178,&local_179,(type *)0x0);
    std::optional<bidfx_public_api::price::pixie::FieldDef>::~optional(&local_1b8);
    std::__cxx11::string::~string(local_1d8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
    if (!bVar1) {
      testing::Message::Message(&local_1e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_208,(internal *)local_178,
                 (AssertionResult *)"extendable_data_dictionary1.FieldDefByName(endSize.name_)",
                 "true","false",pcVar2);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
                 ,0x72,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      testing::Message::~Message(&local_1e0);
    }
    gtest_ar__1.message_.ptr_._5_3_ = 0;
    gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
      bidfx_public_api::price::pixie::FieldDef::FieldDef((FieldDef *)&gtest_ar.message_,local_a8);
      bidfx_public_api::price::pixie::ExtendableDataDictionary::AddFieldDef
                (local_78,&gtest_ar.message_);
      FieldDef::~FieldDef((FieldDef *)&gtest_ar.message_);
      bidfx_public_api::price::pixie::ExtendableDataDictionary::FieldDefByFid((int)&local_280);
      testing::internal::EqHelper<false>::
      Compare<bidfx_public_api::price::pixie::FieldDef,std::optional<bidfx_public_api::price::pixie::FieldDef>>
                ((EqHelper<false> *)local_248,"endSize",
                 "extendable_data_dictionary1.FieldDefByFid(endSize.fid_)",local_a8,&local_280);
      std::optional<bidfx_public_api::price::pixie::FieldDef>::~optional(&local_280);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
      if (!bVar1) {
        testing::Message::Message(&local_288);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
                   ,0x74,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_288);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_288);
      }
      gtest_ar__1.message_.ptr_._5_3_ = 0;
      gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
      if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
        std::__cxx11::string::string(local_2f8,(string *)&endSize);
        bidfx_public_api::price::pixie::ExtendableDataDictionary::FieldDefByName
                  (&local_2d8,local_78,local_2f8);
        testing::internal::EqHelper<false>::
        Compare<bidfx_public_api::price::pixie::FieldDef,std::optional<bidfx_public_api::price::pixie::FieldDef>>
                  ((EqHelper<false> *)local_2a0,"endSize",
                   "extendable_data_dictionary1.FieldDefByName(endSize.name_)",local_a8,&local_2d8);
        std::optional<bidfx_public_api::price::pixie::FieldDef>::~optional(&local_2d8);
        std::__cxx11::string::~string(local_2f8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
        if (!bVar1) {
          testing::Message::Message(&local_300);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
          testing::internal::AssertHelper::AssertHelper
                    (&local_308,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
                     ,0x75,pcVar2);
          testing::internal::AssertHelper::operator=(&local_308,&local_300);
          testing::internal::AssertHelper::~AssertHelper(&local_308);
          testing::Message::~Message(&local_300);
        }
        gtest_ar__1.message_.ptr_._5_3_ = 0;
        gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
        if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
          gtest_ar__1.message_.ptr_._4_4_ = 0;
        }
      }
    }
  }
  FieldDef::~FieldDef(local_a8);
  ExtendableDataDictionary::~ExtendableDataDictionary(local_78);
  return;
}

Assistant:

TEST(ExtendedDataDictionaryTest, TestNewFieldsDefsCanBeAddedToTheEndOfTheDictionary)
{
    ExtendableDataDictionary extendable_data_dictionary1 = CreateExtendableDataDictionary();
    FieldDef endSize(5000, FieldTypeEnum::LONG, "EndSize", FieldEncodingEnum::FIXED1, 1);
    ASSERT_FALSE(extendable_data_dictionary1.FieldDefByFid(endSize.fid_));
    ASSERT_FALSE(extendable_data_dictionary1.FieldDefByName(endSize.name_));
    extendable_data_dictionary1.AddFieldDef(endSize);
    ASSERT_EQ(endSize, extendable_data_dictionary1.FieldDefByFid(endSize.fid_));
    ASSERT_EQ(endSize, extendable_data_dictionary1.FieldDefByName(endSize.name_));
}